

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xbrz.cpp
# Opt level: O0

void (anonymous_namespace)::Scaler2x<(anonymous_namespace)::ColorGradientRGB>::alphaGrad<5u,6u>
               (uint32_t *pixBack,uint32_t pixFront)

{
  uint32_t pixFront_local;
  uint32_t *pixBack_local;
  
  ColorGradientRGB::alphaGrad<5u,6u>(pixBack,pixFront);
  return;
}

Assistant:

static void alphaGrad(uint32_t& pixBack, uint32_t pixFront) { ColorGradient::template alphaGrad<M, N>(pixBack, pixFront); }